

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

void arena_reset_prepare_background_thread(tsd_t *tsd,uint arena_ind)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  background_thread_info_t *pbVar3;
  int iVar4;
  ulong uVar5;
  mutex_prof_data_t *data;
  pthread_mutex_t *__mutex;
  
  iVar4 = pthread_mutex_trylock
                    ((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&duckdb_je_background_thread_lock);
    duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  pbVar3 = duckdb_je_background_thread_info;
  duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops =
       duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    duckdb_je_background_thread_lock.field_0.witness.link.qre_prev =
         (witness_t *)
         (duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  if ((duckdb_je_background_thread_enabled_state.repr & 1U) != 0) {
    uVar5 = (ulong)arena_ind % duckdb_je_max_background_threads;
    __mutex = (pthread_mutex_t *)((long)&duckdb_je_background_thread_info[uVar5].mtx.field_0 + 0x48)
    ;
    iVar4 = pthread_mutex_trylock(__mutex);
    if (iVar4 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&pbVar3[uVar5].mtx);
      pbVar3[uVar5].mtx.field_0.field_0.locked.repr = true;
    }
    puVar1 = &pbVar3[uVar5].mtx.field_0.field_0.prof_data.n_lock_ops;
    *puVar1 = *puVar1 + 1;
    if (&(pbVar3[uVar5].mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
      pbVar3[uVar5].mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
      ppwVar2 = &pbVar3[uVar5].mtx.field_0.witness.link.qre_prev;
      *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
    }
    pbVar3[uVar5].state = background_thread_paused;
    pbVar3[uVar5].mtx.field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
    return;
  }
  return;
}

Assistant:

static void
arena_reset_prepare_background_thread(tsd_t *tsd, unsigned arena_ind) {
	/* Temporarily disable the background thread during arena reset. */
	if (have_background_thread) {
		malloc_mutex_lock(tsd_tsdn(tsd), &background_thread_lock);
		if (background_thread_enabled()) {
			background_thread_info_t *info =
			    background_thread_info_get(arena_ind);
			assert(info->state == background_thread_started);
			malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
			info->state = background_thread_paused;
			malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
		}
	}
}